

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,Terminator *term,void *data)

{
  SemanticOp SVar1;
  LexicalScoping LVar2;
  int iVar3;
  SemanticException *this_00;
  
  SVar1 = *data;
  term->semantic_ = SVar1;
  iVar3 = (term->token_).token_;
  if (iVar3 == 0x115) {
    *(undefined4 *)((long)data + 4) = 0;
    LVar2 = SearchName(this,(term->token_).field_0.str_);
    term->scoping_ = LVar2;
    iVar3 = (term->token_).token_;
  }
  else {
    if (SVar1 != SemanticOp_Read) {
      __assert_fail("exp_var_data->semantic_op_ == SemanticOp_Read",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                    ,0x1ce,"virtual void luna::SemanticAnalysisVisitor::Visit(Terminator *, void *)"
                   );
    }
    if (iVar3 < 0x116) {
      if (iVar3 == 0x106) {
LAB_00130b68:
        *(undefined4 *)((long)data + 4) = 2;
        return;
      }
      if (iVar3 == 0x10c) {
        *(undefined4 *)((long)data + 4) = 1;
        return;
      }
      if (iVar3 == 0x112) goto LAB_00130b68;
    }
    else {
      if (iVar3 == 0x116) {
        *(undefined4 *)((long)data + 4) = 4;
        return;
      }
      if (iVar3 == 0x117) {
        *(undefined4 *)((long)data + 4) = 3;
        return;
      }
      if (iVar3 == 0x11d) {
        *(undefined4 *)((long)data + 4) = 5;
        goto LAB_00130b32;
      }
    }
  }
  if (iVar3 != 0x11d) {
    return;
  }
LAB_00130b32:
  if (this->current_function_->has_vararg != false) {
    *(undefined1 *)((long)data + 8) = 1;
    return;
  }
  this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
  SemanticException::SemanticException(this_00,"function has no \'...\' param",&term->token_);
  __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
}

Assistant:

void SemanticAnalysisVisitor::Visit(Terminator *term, void *data)
    {
        // Current term read and write semantic
        auto exp_var_data = static_cast<ExpVarData *>(data);
        term->semantic_ = exp_var_data->semantic_op_;
        if (term->token_.token_ != Token_Id)
            assert(exp_var_data->semantic_op_ == SemanticOp_Read);

        // Set Expression type
        switch (term->token_.token_)
        {
            case Token_Nil: exp_var_data->exp_type_ = ExpType_Nil; break;
            case Token_Id: exp_var_data->exp_type_ = ExpType_Unknown; break;
            case Token_Number: exp_var_data->exp_type_ = ExpType_Number; break;
            case Token_String: exp_var_data->exp_type_ = ExpType_String; break;
            case Token_VarArg: exp_var_data->exp_type_ = ExpType_VarArg; break;
            case Token_True: case Token_False: exp_var_data->exp_type_ = ExpType_Bool; break;
        }

        // Search lexical scoping of name
        if (term->token_.token_ == Token_Id)
            term->scoping_ = SearchName(term->token_.str_);

        // Check function has vararg
        if (term->token_.token_ == Token_VarArg && !HasVararg())
            throw SemanticException("function has no '...' param", term->token_);

        // Set results any count
        if (term->token_.token_ == Token_VarArg)
            exp_var_data->results_any_count_ = true;
    }